

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void PrintDeclarator(FLispString *out,ZCC_TreeNode *node)

{
  FLispString::Break(out);
  FLispString::Open(out,"declarator");
  FLispString::AddHex(out,*(uint *)&node[1].SiblingPrev);
  PrintNodes(out,node[1].SiblingNext,true,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintDeclarator(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Declarator *dnode = (ZCC_Declarator *)node;
	out.Break();
	out.Open("declarator");
	out.AddHex(dnode->Flags);
	PrintNodes(out, dnode->Type);
	out.Close();
}